

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

void secp256k1_modinv64(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  uint64_t f;
  ulong uVar4;
  ulong sign;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t q;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint64_t r;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  uint64_t c1;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 local_58;
  
  d.v[2] = 0;
  d.v[3] = 0;
  d.v[4] = 0;
  d.v[0] = 0;
  d.v[1] = 0;
  local_58.v[3] = 0;
  local_58.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[2] = 0;
  local_58.v[0] = 1;
  local_120 = (modinfo->modulus).v[0];
  local_100 = (modinfo->modulus).v[1];
  local_108 = (modinfo->modulus).v[2];
  uVar8 = (modinfo->modulus).v[3];
  sign = (modinfo->modulus).v[4];
  local_f8 = x->v[0];
  local_110 = x->v[1];
  local_118 = x->v[2];
  uVar3 = x->v[3];
  uVar7 = x->v[4];
  uVar17 = 0xffffffffffffffff;
  for (iVar12 = 0; iVar12 != 10; iVar12 = iVar12 + 1) {
    iVar2 = 0x3b;
    uVar16 = 8;
    uVar9 = 0;
    uVar19 = 0;
    uVar4 = local_120;
    uVar10 = local_f8;
    uVar18 = uVar16;
    while (bVar20 = iVar2 != 0, iVar2 = iVar2 + -1, bVar20) {
      uVar5 = (long)uVar17 >> 0x3f;
      uVar6 = -(ulong)((uint)uVar10 & 1);
      uVar10 = ((uVar5 ^ uVar4) - uVar5 & uVar6) + uVar10;
      uVar9 = uVar9 + ((uVar5 ^ uVar16) - uVar5 & uVar6);
      uVar18 = uVar18 + ((uVar5 ^ uVar19) - uVar5 & uVar6);
      uVar6 = uVar6 & uVar5;
      uVar17 = (uVar17 ^ uVar6) - 1;
      uVar4 = uVar4 + (uVar10 & uVar6);
      uVar10 = uVar10 >> 1;
      uVar16 = ((uVar9 & uVar6) + uVar16) * 2;
      uVar19 = ((uVar6 & uVar18) + uVar19) * 2;
    }
    t.u = uVar16;
    t.v = uVar19;
    t.q = uVar9;
    t.r = uVar18;
    secp256k1_modinv64_update_de_62(&d,&local_58,&t,modinfo);
    lVar11 = SUB168(SEXT816((long)uVar19) * SEXT816((long)local_f8),8) +
             SUB168(SEXT816((long)uVar16) * SEXT816((long)local_120),8) +
             (ulong)CARRY8(uVar19 * local_f8,uVar16 * local_120);
    lVar13 = SUB168(SEXT816((long)uVar18) * SEXT816((long)local_f8),8) +
             SUB168(SEXT816((long)uVar9) * SEXT816((long)local_120),8) +
             (ulong)CARRY8(uVar18 * local_f8,uVar9 * local_120);
    uVar6 = uVar19 * local_f8 + uVar16 * local_120 >> 0x3e | lVar11 * 4;
    uVar10 = uVar18 * local_f8 + uVar9 * local_120 >> 0x3e | lVar13 * 4;
    uVar4 = uVar19 * local_110 + uVar16 * local_100;
    local_120 = uVar4 + uVar6;
    lVar11 = SUB168(SEXT816((long)uVar19) * SEXT816((long)local_110),8) +
             SUB168(SEXT816((long)uVar16) * SEXT816((long)local_100),8) +
             (ulong)CARRY8(uVar19 * local_110,uVar16 * local_100) + (lVar11 >> 0x3e) +
             (ulong)CARRY8(uVar4,uVar6);
    uVar4 = uVar18 * local_110 + uVar9 * local_100;
    local_f8 = uVar4 + uVar10;
    lVar13 = SUB168(SEXT816((long)uVar18) * SEXT816((long)local_110),8) +
             SUB168(SEXT816((long)uVar9) * SEXT816((long)local_100),8) +
             (ulong)CARRY8(uVar18 * local_110,uVar9 * local_100) + (lVar13 >> 0x3e) +
             (ulong)CARRY8(uVar4,uVar10);
    uVar6 = lVar11 * 4 | local_120 >> 0x3e;
    local_120 = local_120 & 0x3fffffffffffffff;
    uVar10 = lVar13 * 4 | local_f8 >> 0x3e;
    local_f8 = local_f8 & 0x3fffffffffffffff;
    uVar4 = uVar19 * local_118 + uVar16 * local_108;
    local_100 = uVar4 + uVar6;
    lVar14 = SUB168(SEXT816((long)uVar19) * SEXT816((long)local_118),8) +
             SUB168(SEXT816((long)uVar16) * SEXT816((long)local_108),8) +
             (ulong)CARRY8(uVar19 * local_118,uVar16 * local_108) + (lVar11 >> 0x3e) +
             (ulong)CARRY8(uVar4,uVar6);
    uVar4 = uVar18 * local_118 + uVar9 * local_108;
    local_110 = uVar4 + uVar10;
    lVar11 = SUB168(SEXT816((long)uVar18) * SEXT816((long)local_118),8) +
             SUB168(SEXT816((long)uVar9) * SEXT816((long)local_108),8) +
             (ulong)CARRY8(uVar18 * local_118,uVar9 * local_108) + (lVar13 >> 0x3e) +
             (ulong)CARRY8(uVar4,uVar10);
    uVar6 = lVar14 * 4 | local_100 >> 0x3e;
    local_100 = local_100 & 0x3fffffffffffffff;
    uVar10 = lVar11 * 4 | local_110 >> 0x3e;
    local_110 = local_110 & 0x3fffffffffffffff;
    uVar4 = uVar19 * uVar3 + uVar16 * uVar8;
    local_108 = uVar4 + uVar6;
    lVar13 = SUB168(SEXT816((long)uVar19) * SEXT816((long)uVar3),8) +
             SUB168(SEXT816((long)uVar16) * SEXT816((long)uVar8),8) +
             (ulong)CARRY8(uVar19 * uVar3,uVar16 * uVar8) + (lVar14 >> 0x3e) +
             (ulong)CARRY8(uVar4,uVar6);
    uVar4 = uVar18 * uVar3 + uVar9 * uVar8;
    local_118 = uVar4 + uVar10;
    lVar11 = SUB168(SEXT816((long)uVar18) * SEXT816((long)uVar3),8) +
             SUB168(SEXT816((long)uVar9) * SEXT816((long)uVar8),8) +
             (ulong)CARRY8(uVar18 * uVar3,uVar9 * uVar8) + (lVar11 >> 0x3e) +
             (ulong)CARRY8(uVar4,uVar10);
    uVar15 = lVar13 * 4 | local_108 >> 0x3e;
    local_108 = local_108 & 0x3fffffffffffffff;
    uVar5 = lVar11 * 4 | local_118 >> 0x3e;
    local_118 = local_118 & 0x3fffffffffffffff;
    uVar6 = uVar19 * uVar7 + uVar16 * sign;
    uVar8 = uVar6 + uVar15;
    auVar1 = SEXT816((long)sign);
    uVar4 = uVar9 * sign;
    uVar10 = uVar18 * uVar7 + uVar4;
    uVar3 = uVar10 + uVar5;
    sign = (SUB168(SEXT816((long)uVar19) * SEXT816((long)uVar7),8) +
            SUB168(SEXT816((long)uVar16) * SEXT816((long)sign),8) +
            (ulong)CARRY8(uVar19 * uVar7,uVar16 * sign) + (lVar13 >> 0x3e) +
           (ulong)CARRY8(uVar6,uVar15)) * 4 | uVar8 >> 0x3e;
    uVar7 = (SUB168(SEXT816((long)uVar18) * SEXT816((long)uVar7),8) +
             SUB168(SEXT816((long)uVar9) * auVar1,8) + (ulong)CARRY8(uVar18 * uVar7,uVar4) +
             (lVar11 >> 0x3e) + (ulong)CARRY8(uVar10,uVar5)) * 4 | uVar3 >> 0x3e;
    uVar8 = uVar8 & 0x3fffffffffffffff;
    uVar3 = uVar3 & 0x3fffffffffffffff;
  }
  secp256k1_modinv64_normalize_62(&d,sign,modinfo);
  x->v[4] = d.v[4];
  x->v[2] = d.v[2];
  x->v[3] = d.v[3];
  x->v[0] = d.v[0];
  x->v[1] = d.v[1];
  return;
}

Assistant:

static void secp256k1_modinv64(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int i;
    int64_t zeta = -1; /* zeta = -(delta+1/2); delta starts at 1/2. */

    /* Do 10 iterations of 59 divsteps each = 590 divsteps. This suffices for 256-bit inputs. */
    for (i = 0; i < 10; ++i) {
        /* Compute transition matrix and new zeta after 59 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        zeta = secp256k1_modinv64_divsteps_59(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
        secp256k1_modinv64_update_fg_62(&f, &g, &t);
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */
#ifdef VERIFY
    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  (secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) == 0)));
#endif

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[4], modinfo);
    *x = d;
}